

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O3

void * cuddLevelQueueEnqueue(DdLevelQueue *queue,void *key,int level)

{
  int iVar1;
  int iVar2;
  DdQueueItem **ppDVar3;
  DdQueueItem *pDVar4;
  DdQueueItem *pDVar5;
  DdQueueItem *pDVar6;
  DdQueueItem **ppDVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  DdLevelQueue *pDVar12;
  size_t __size;
  
  for (pDVar6 = queue->buckets[(int)((uint)((int)key * 0xc00005) >> ((byte)queue->shift & 0x1f))];
      pDVar6 != (DdQueueItem *)0x0; pDVar6 = pDVar6->cnext) {
    if (pDVar6->key == key) {
      return pDVar6;
    }
  }
  pDVar6 = queue->freelist;
  if (pDVar6 == (DdQueueItem *)0x0) {
    __size = (size_t)queue->itemsize;
    pDVar6 = (DdQueueItem *)malloc(__size);
    if (pDVar6 == (DdQueueItem *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    queue->freelist = pDVar6->next;
    __size = (size_t)queue->itemsize;
  }
  memset(pDVar6,0,__size);
  pDVar6->key = key;
  iVar1 = queue->size;
  queue->size = iVar1 + 1;
  ppDVar3 = queue->last;
  lVar10 = (long)level;
  if (ppDVar3[lVar10] == (DdQueueItem *)0x0) {
    lVar11 = lVar10;
    if (level == 0) {
      lVar11 = 0;
    }
    else {
      do {
        if (ppDVar3[lVar11] != (DdQueueItem *)0x0) goto LAB_007de3b7;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      lVar11 = 0;
LAB_007de3b7:
      lVar11 = (long)(int)lVar11;
    }
    if (ppDVar3[lVar11] == (DdQueueItem *)0x0) {
      pDVar6->next = (DdQueueItem *)queue->first;
      pDVar12 = queue;
    }
    else {
      pDVar6->next = ppDVar3[lVar11]->next;
      pDVar12 = (DdLevelQueue *)ppDVar3[lVar11];
    }
  }
  else {
    pDVar6->next = ppDVar3[lVar10]->next;
    pDVar12 = (DdLevelQueue *)ppDVar3[lVar10];
  }
  pDVar12->first = pDVar6;
  ppDVar3[lVar10] = pDVar6;
  iVar2 = queue->maxsize;
  ppDVar3 = queue->buckets;
  ppDVar7 = ppDVar3;
  if (iVar2 <= iVar1) {
    iVar1 = queue->numBuckets;
    ppDVar7 = (DdQueueItem **)calloc(1,(long)(iVar1 * 2) * 8);
    iVar8 = queue->shift + -1;
    queue->buckets = ppDVar7;
    queue->numBuckets = iVar1 * 2;
    queue->shift = iVar8;
    queue->maxsize = iVar2 * 2;
    if (0 < (long)iVar1) {
      lVar10 = 0;
      do {
        pDVar5 = ppDVar3[lVar10];
        while (pDVar5 != (DdQueueItem *)0x0) {
          uVar9 = (uint)(*(int *)&pDVar5->key * 0xc00005) >> ((byte)iVar8 & 0x1f);
          pDVar4 = pDVar5->cnext;
          pDVar5->cnext = ppDVar7[(int)uVar9];
          ppDVar7[(int)uVar9] = pDVar5;
          pDVar5 = pDVar4;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar1);
    }
    if (ppDVar3 != (DdQueueItem **)0x0) {
      free(ppDVar3);
      ppDVar7 = queue->buckets;
    }
  }
  uVar9 = (uint)(*(int *)&pDVar6->key * 0xc00005) >> ((byte)queue->shift & 0x1f);
  pDVar6->cnext = ppDVar7[(int)uVar9];
  ppDVar7[(int)uVar9] = pDVar6;
  return pDVar6;
}

Assistant:

void *
cuddLevelQueueEnqueue(
  DdLevelQueue * queue /* level queue */,
  void * key /* key to be enqueued */,
  int  level /* level at which to insert */)
{
    int plevel;
    DdQueueItem *item;

#ifdef DD_DEBUG
    assert(level < queue->levels);
#endif
    /* Check whether entry for this node exists. */
    item = hashLookup(queue,key);
    if (item != NULL) return(item);

    /* Get a free item from either the free list or the memory manager. */
    if (queue->freelist == NULL) {
        item = (DdQueueItem *) ABC_ALLOC(char, queue->itemsize);
        if (item == NULL)
            return(NULL);
    } else {
        item = queue->freelist;
        queue->freelist = item->next;
    }
    /* Initialize. */
    memset(item, 0, queue->itemsize);
    item->key = key;
    /* Update stats. */
    queue->size++;

    if (queue->last[level]) {
        /* There are already items for this level in the queue. */
        item->next = queue->last[level]->next;
        queue->last[level]->next = item;
    } else {
        /* There are no items at the current level.  Look for the first
        ** non-empty level preceeding this one. */
        plevel = level;
        while (plevel != 0 && queue->last[plevel] == NULL)
            plevel--;
        if (queue->last[plevel] == NULL) {
            /* No element precedes this one in the queue. */
            item->next = (DdQueueItem *) queue->first;
            queue->first = item;
        } else {
            item->next = queue->last[plevel]->next;
            queue->last[plevel]->next = item;
        }
    }
    queue->last[level] = item;

    /* Insert entry for the key in the hash table. */
    if (hashInsert(queue,item) == 0) {
        return(NULL);
    }
    return(item);

}